

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

bool __thiscall
server_context::can_be_detokenized
          (server_context *this,llama_context *ctx,vector<int,_std::allocator<int>_> *tokens)

{
  int *piVar1;
  undefined8 uVar2;
  int *piVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> *__range1;
  int *piVar5;
  
  uVar2 = llama_get_model(ctx);
  uVar2 = llama_model_get_vocab(uVar2);
  iVar4 = llama_vocab_n_tokens(uVar2);
  piVar1 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar3 = (tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  do {
    piVar5 = piVar3;
    if ((piVar5 == piVar1) || (*piVar5 < 0)) break;
    piVar3 = piVar5 + 1;
  } while (*piVar5 < iVar4);
  return piVar5 == piVar1;
}

Assistant:

bool can_be_detokenized(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
        const llama_model * model = llama_get_model(ctx);
        const llama_vocab * vocab = llama_model_get_vocab(model);
        const int32_t n_vocab = llama_vocab_n_tokens(vocab);
        for (const auto & token : tokens) {
            if (token < 0 || token >= n_vocab) {
                return false;
            }
        }
        return true;
    }